

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_tt.c
# Opt level: O0

void UINT32Swap(HPDF_UINT32 *value)

{
  byte local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  HPDF_UINT32 *pHStack_10;
  HPDF_BYTE b [4];
  HPDF_UINT32 *value_local;
  
  pHStack_10 = value;
  HPDF_MemCpy(&local_14,(HPDF_BYTE *)value,4);
  *pHStack_10 = (uint)local_14 << 0x18 | (uint)local_13 << 0x10 | (uint)local_12 << 8 |
                (uint)local_11;
  return;
}

Assistant:

static void
UINT32Swap (HPDF_UINT32  *value)
{
    HPDF_BYTE b[4];

    HPDF_MemCpy (b, (HPDF_BYTE *)value, 4);
    *value = (HPDF_UINT32)((HPDF_UINT32)b[0] << 24 |
             (HPDF_UINT32)b[1] << 16 |
             (HPDF_UINT32)b[2] << 8 |
             (HPDF_UINT32)b[3]);
}